

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdCreateSighash(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                    int hash_type,char *pubkey,char *redeem_script,int64_t value_satoshi,
                    int sighash_type,bool sighash_anyone_can_pay,char **sighash)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  OutPoint *in_RCX;
  char *in_RDX;
  uint32_t in_R8D;
  char *in_stack_00000008;
  SigHashType *in_stack_00000010;
  int64_t in_stack_00000018;
  uint8_t in_stack_00000020;
  byte in_stack_00000028;
  undefined8 *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_3;
  TransactionContext tx_2;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  SigHashType sighashtype;
  ByteData sighash_bytes;
  Amount value;
  bool is_bitcoin;
  WitnessVersion version;
  HashType core_hash_type;
  AddressType addr_type;
  undefined4 in_stack_fffffffffffff558;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff55c;
  ConfidentialTransactionContext *in_stack_fffffffffffff560;
  string *in_stack_fffffffffffff570;
  undefined8 in_stack_fffffffffffff578;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff580;
  allocator *paVar6;
  bool *in_stack_fffffffffffff5b8;
  string *in_stack_fffffffffffff5c0;
  undefined7 in_stack_fffffffffffff5e8;
  undefined1 in_stack_fffffffffffff5ef;
  SigHashType *in_stack_fffffffffffff5f0;
  Script *in_stack_fffffffffffff5f8;
  Script *redeem_script_00;
  OutPoint *in_stack_fffffffffffff600;
  ConfidentialTransactionContext *in_stack_fffffffffffff608;
  ConfidentialTransactionContext *this;
  WitnessVersion in_stack_fffffffffffff620;
  WitnessVersion version_00;
  Amount *in_stack_fffffffffffff628;
  SigHashType *in_stack_fffffffffffff630;
  Pubkey *in_stack_fffffffffffff638;
  OutPoint *in_stack_fffffffffffff640;
  TransactionContext *in_stack_fffffffffffff648;
  WitnessVersion in_stack_fffffffffffff660;
  string local_928;
  SigHashType local_908;
  allocator local_8f9;
  string local_8f8;
  Pubkey local_8d8;
  allocator local_8b9;
  string local_8b8;
  Txid local_898;
  OutPoint local_878;
  allocator local_831;
  string local_830 [216];
  SigHashType local_758;
  allocator local_749;
  string local_748;
  Pubkey local_728;
  string local_709;
  Txid local_6e8;
  OutPoint local_6c8;
  allocator local_681;
  string local_680 [222];
  undefined1 local_5a2;
  allocator local_5a1;
  string local_5a0 [32];
  CfdSourceLocation local_580;
  SigHashType local_568;
  Script local_559;
  undefined1 local_4f9 [137];
  string local_470 [216];
  SigHashType local_398;
  allocator local_389;
  string local_388;
  Script local_368;
  allocator local_329;
  string local_328;
  Txid local_308;
  OutPoint local_2e8;
  allocator local_2a1;
  string local_2a0 [222];
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  CfdSourceLocation local_1a0;
  SigHashType local_184;
  ByteData local_178;
  Amount local_160;
  byte local_14b;
  undefined1 local_14a;
  allocator local_149;
  string local_148 [32];
  CfdSourceLocation local_128;
  undefined4 local_110;
  int local_10c;
  AddressType local_108;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  byte local_31;
  uint32_t local_2c;
  OutPoint *local_28;
  char *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff578 >> 0x20);
  local_31 = in_stack_00000028 & 1;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x90a;
    local_60.funcname = "CfdCreateSighash";
    cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
    local_82 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff580,error_code,in_stack_fffffffffffff570);
    local_82 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString((char *)local_28);
  if (!bVar1) {
    if (in_stack_00000030 == (undefined8 *)0x0) {
      local_e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_e0.filename = local_e0.filename + 1;
      local_e0.line = 0x916;
      local_e0.funcname = "CfdCreateSighash";
      cfd::core::logger::warn<>(&local_e0,"sighash is null.");
      local_102 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"Failed to parameter. sighash is null.",&local_101);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff580,error_code,in_stack_fffffffffffff570);
      local_102 = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_108 = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffff5c0 >> 0x20))
    ;
    local_110 = 0xffffffff;
    switch(local_108) {
    case kP2shAddress:
      local_10c = 1;
      break;
    case kP2pkhAddress:
      local_10c = 0;
      break;
    case kP2wshAddress:
    case kP2shP2wshAddress:
      local_10c = 3;
      local_110 = 0;
      break;
    case kP2wpkhAddress:
    case kP2shP2wpkhAddress:
      local_10c = 2;
      local_110 = 0;
      break;
    default:
      local_128.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_128.filename = local_128.filename + 1;
      local_128.line = 0x933;
      local_128.funcname = "CfdCreateSighash";
      cfd::core::logger::warn<>(&local_128,"hashtype is illegal.");
      local_14a = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Failed to parameter. hashtype is illegal.",&local_149)
      ;
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff580,error_code,in_stack_fffffffffffff570);
      local_14a = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_14b = 0;
    cfd::capi::ConvertNetType
              ((int)((ulong)in_stack_fffffffffffff5c0 >> 0x20),in_stack_fffffffffffff5b8);
    cfd::core::Amount::Amount(&local_160,in_stack_00000018);
    cfd::core::ByteData::ByteData(&local_178);
    cfd::core::SigHashType::Create(&local_184,in_stack_00000020,(bool)(local_31 & 1),false);
    if ((local_10c == 1) || (local_10c == 3)) {
      bVar1 = cfd::capi::IsEmptyString((char *)in_stack_00000010);
      if (bVar1) {
        local_1a0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
        local_1a0.filename = local_1a0.filename + 1;
        local_1a0.line = 0x942;
        local_1a0.funcname = "CfdCreateSighash";
        cfd::core::logger::warn<>(&local_1a0,"redeem script is null or empty.");
        local_1c2 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1c0,"Failed to parameter. redeem script is null or empty.",&local_1c1);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffff580,error_code,in_stack_fffffffffffff570);
        local_1c2 = 0;
        __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      if ((local_14b & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_470,local_20,(allocator *)(local_4f9 + 0x88));
        cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                  (in_stack_fffffffffffff560,
                   (string *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        std::__cxx11::string::~string(local_470);
        std::allocator<char>::~allocator((allocator<char> *)(local_4f9 + 0x88));
        this = (ConfidentialTransactionContext *)local_4f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)((long)local_4f9 + 1),(char *)local_28,(allocator *)this);
        cfd::core::Txid::Txid((Txid *)((long)local_4f9 + 0x21),(string *)((long)local_4f9 + 1));
        cfd::core::OutPoint::OutPoint
                  ((OutPoint *)((long)local_4f9 + 0x41),(Txid *)((long)local_4f9 + 0x21),local_2c);
        redeem_script_00 = &local_559;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)((long)&local_559._vptr_Script + 1),(char *)in_stack_00000010,
                   (allocator *)redeem_script_00);
        cfd::core::Script::Script
                  ((Script *)
                   ((long)&local_559.script_stack_.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1),
                   (string *)((long)&local_559._vptr_Script + 1));
        cfd::core::SigHashType::SigHashType(&local_568,&local_184);
        uVar5 = local_110;
        cfd::ConfidentialTransactionContext::CreateSignatureHash
                  (this,local_28,redeem_script_00,in_stack_00000010,
                   (Amount *)CONCAT17(in_stack_fffffffffffff5ef,in_stack_fffffffffffff5e8),
                   in_stack_fffffffffffff620);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffff560,
                   (ByteData *)CONCAT44(in_stack_fffffffffffff55c,uVar5));
        cfd::core::ByteData::~ByteData((ByteData *)0x61f0ea);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff560);
        std::__cxx11::string::~string((string *)((long)&local_559._vptr_Script + 1));
        std::allocator<char>::~allocator((allocator<char> *)&local_559);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x61f11e);
        cfd::core::Txid::~Txid((Txid *)0x61f12b);
        std::__cxx11::string::~string((string *)((long)local_4f9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_4f9);
        cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                  (in_stack_fffffffffffff560);
      }
      else {
        paVar6 = &local_2a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2a0,local_20,paVar6);
        cfd::TransactionContext::TransactionContext
                  ((TransactionContext *)in_stack_fffffffffffff560,
                   (string *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        std::__cxx11::string::~string(local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
        paVar6 = &local_329;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_328,(char *)local_28,paVar6);
        cfd::core::Txid::Txid(&local_308,&local_328);
        cfd::core::OutPoint::OutPoint(&local_2e8,&local_308,local_2c);
        paVar6 = &local_389;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_388,(char *)in_stack_00000010,paVar6);
        version_00 = (WitnessVersion)in_stack_00000010;
        cfd::core::Script::Script(&local_368,&local_388);
        cfd::core::SigHashType::SigHashType(&local_398,&local_184);
        uVar5 = local_110;
        cfd::TransactionContext::CreateSignatureHash
                  ((TransactionContext *)in_stack_fffffffffffff608,in_stack_fffffffffffff600,
                   in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
                   (Amount *)CONCAT17(in_stack_fffffffffffff5ef,in_stack_fffffffffffff5e8),
                   version_00);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffff560,
                   (ByteData *)CONCAT44(in_stack_fffffffffffff55c,uVar5));
        cfd::core::ByteData::~ByteData((ByteData *)0x61ed7a);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff560);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x61edae);
        cfd::core::Txid::~Txid((Txid *)0x61edbb);
        std::__cxx11::string::~string((string *)&local_328);
        std::allocator<char>::~allocator((allocator<char> *)&local_329);
        cfd::TransactionContext::~TransactionContext
                  ((TransactionContext *)in_stack_fffffffffffff560);
      }
    }
    else {
      uVar2 = cfd::capi::IsEmptyString(in_stack_00000008);
      if ((bool)uVar2) {
        local_580.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
        local_580.filename = local_580.filename + 1;
        local_580.line = 0x959;
        local_580.funcname = "CfdCreateSighash";
        cfd::core::logger::warn<>(&local_580,"pubkey is null or empty.");
        local_5a2 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5a0,"Failed to parameter. pubkey is null or empty.",&local_5a1);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffff580,error_code,in_stack_fffffffffffff570);
        local_5a2 = 0;
        __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      if ((local_14b & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_830,local_20,&local_831);
        cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                  (in_stack_fffffffffffff560,
                   (string *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        std::__cxx11::string::~string(local_830);
        std::allocator<char>::~allocator((allocator<char> *)&local_831);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8b8,(char *)local_28,&local_8b9);
        cfd::core::Txid::Txid(&local_898,&local_8b8);
        cfd::core::OutPoint::OutPoint(&local_878,&local_898,local_2c);
        paVar6 = &local_8f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8f8,in_stack_00000008,paVar6);
        cfd::core::Pubkey::Pubkey(&local_8d8,&local_8f8);
        cfd::core::SigHashType::SigHashType(&local_908,&local_184);
        uVar5 = local_110;
        cfd::ConfidentialTransactionContext::CreateSignatureHash
                  (in_stack_fffffffffffff608,in_stack_fffffffffffff600,
                   (Pubkey *)in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
                   (Amount *)CONCAT17(uVar2,in_stack_fffffffffffff5e8),in_stack_fffffffffffff620);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffff560,
                   (ByteData *)CONCAT44(in_stack_fffffffffffff55c,uVar5));
        cfd::core::ByteData::~ByteData((ByteData *)0x61f8fa);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x61f907);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x61f92e);
        cfd::core::Txid::~Txid((Txid *)0x61f93b);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
        cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                  (in_stack_fffffffffffff560);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_680,local_20,&local_681);
        cfd::TransactionContext::TransactionContext
                  ((TransactionContext *)in_stack_fffffffffffff560,
                   (string *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        std::__cxx11::string::~string(local_680);
        std::allocator<char>::~allocator((allocator<char> *)&local_681);
        in_stack_fffffffffffff5c0 = &local_709;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_709.field_0x1,(char *)local_28,
                   (allocator *)in_stack_fffffffffffff5c0);
        cfd::core::Txid::Txid(&local_6e8,(string *)&local_709.field_0x1);
        cfd::core::OutPoint::OutPoint(&local_6c8,&local_6e8,local_2c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_748,in_stack_00000008,&local_749);
        cfd::core::Pubkey::Pubkey(&local_728,&local_748);
        cfd::core::SigHashType::SigHashType(&local_758,&local_184);
        uVar5 = local_110;
        cfd::TransactionContext::CreateSignatureHash
                  (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                   in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff660);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffff560,
                   (ByteData *)CONCAT44(in_stack_fffffffffffff55c,uVar5));
        cfd::core::ByteData::~ByteData((ByteData *)0x61f5ae);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x61f5bb);
        std::__cxx11::string::~string((string *)&local_748);
        std::allocator<char>::~allocator((allocator<char> *)&local_749);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x61f5e2);
        cfd::core::Txid::~Txid((Txid *)0x61f5ef);
        std::__cxx11::string::~string((string *)&local_709.field_0x1);
        std::allocator<char>::~allocator((allocator<char> *)&local_709);
        cfd::TransactionContext::~TransactionContext
                  ((TransactionContext *)in_stack_fffffffffffff560);
      }
    }
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_928,&local_178);
    pcVar4 = cfd::capi::CreateString(in_stack_fffffffffffff5c0);
    *in_stack_00000030 = pcVar4;
    std::__cxx11::string::~string((string *)&local_928);
    local_4 = 0;
    cfd::core::ByteData::~ByteData((ByteData *)0x61fb07);
    return local_4;
  }
  local_a0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_a0.filename = local_a0.filename + 1;
  local_a0.line = 0x910;
  local_a0.funcname = "CfdCreateSighash";
  cfd::core::logger::warn<>(&local_a0,"txid is null or empty.");
  local_c2 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Failed to parameter. txid is null or empty.",&local_c1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff580,error_code,in_stack_fffffffffffff570);
  local_c2 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateSighash(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey,
    const char* redeem_script, int64_t value_satoshi, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    WitnessVersion version = WitnessVersion::kVersionNone;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        version = WitnessVersion::kVersion0;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        version = WitnessVersion::kVersion0;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount value(value_satoshi);
    ByteData sighash_bytes;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    }

    *sighash = CreateString(sighash_bytes.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}